

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int mbedtls_asn1_get_alg(uchar **p,uchar *end,mbedtls_asn1_buf *alg,mbedtls_asn1_buf *params)

{
  size_t local_40;
  size_t len;
  mbedtls_asn1_buf *pmStack_30;
  int ret;
  mbedtls_asn1_buf *params_local;
  mbedtls_asn1_buf *alg_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_4_ = 0xffffff92;
  pmStack_30 = params;
  params_local = alg;
  alg_local = (mbedtls_asn1_buf *)end;
  end_local = (uchar *)p;
  len._4_4_ = mbedtls_asn1_get_tag(p,end,&local_40,0x30);
  p_local._4_4_ = len._4_4_;
  if (len._4_4_ == 0) {
    if ((long)alg_local - *(long *)end_local < 1) {
      p_local._4_4_ = -0x60;
    }
    else {
      params_local->tag = (uint)**(byte **)end_local;
      alg_local = (mbedtls_asn1_buf *)(*(long *)end_local + local_40);
      len._4_4_ = mbedtls_asn1_get_tag((uchar **)end_local,(uchar *)alg_local,&params_local->len,6);
      p_local._4_4_ = len._4_4_;
      if (len._4_4_ == 0) {
        params_local->p = *(uchar **)end_local;
        *(size_t *)end_local = params_local->len + *(long *)end_local;
        if (*(mbedtls_asn1_buf **)end_local == alg_local) {
          mbedtls_platform_zeroize(pmStack_30,0x18);
          p_local._4_4_ = 0;
        }
        else {
          pmStack_30->tag = (uint)**(byte **)end_local;
          *(long *)end_local = *(long *)end_local + 1;
          p_local._4_4_ =
               mbedtls_asn1_get_len((uchar **)end_local,(uchar *)alg_local,&pmStack_30->len);
          if (p_local._4_4_ == 0) {
            pmStack_30->p = *(uchar **)end_local;
            *(size_t *)end_local = pmStack_30->len + *(long *)end_local;
            if (*(mbedtls_asn1_buf **)end_local == alg_local) {
              p_local._4_4_ = 0;
            }
            else {
              p_local._4_4_ = -0x66;
            }
          }
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_get_alg(unsigned char **p,
                         const unsigned char *end,
                         mbedtls_asn1_buf *alg, mbedtls_asn1_buf *params)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return ret;
    }

    if ((end - *p) < 1) {
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    alg->tag = **p;
    end = *p + len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &alg->len, MBEDTLS_ASN1_OID)) != 0) {
        return ret;
    }

    alg->p = *p;
    *p += alg->len;

    if (*p == end) {
        mbedtls_platform_zeroize(params, sizeof(mbedtls_asn1_buf));
        return 0;
    }

    params->tag = **p;
    (*p)++;

    if ((ret = mbedtls_asn1_get_len(p, end, &params->len)) != 0) {
        return ret;
    }

    params->p = *p;
    *p += params->len;

    if (*p != end) {
        return MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    return 0;
}